

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

GUID * FBaseCVar::ToGUID(UCVarValue value,ECVarType type)

{
  UCVarValue trans;
  ECVarType type_local;
  UCVarValue value_local;
  
  if (type == CVAR_String) {
    value_local = FromString(value.String,CVAR_GUID);
  }
  else {
    value_local = value;
    if (type != CVAR_GUID) {
      value_local.String = (char *)0x0;
    }
  }
  return (GUID *)value_local.String;
}

Assistant:

const GUID *FBaseCVar::ToGUID (UCVarValue value, ECVarType type)
{
	UCVarValue trans;

	switch (type)
	{
	case CVAR_String:
		trans = FromString (value.String, CVAR_GUID);
		return trans.pGUID;

	case CVAR_GUID:
		return value.pGUID;

	default:
		return NULL;
	}
}